

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WindowsPath.cpp
# Opt level: O2

void __thiscall WindowsPath::FromFileURL(WindowsPath *this,FileURL *inFileURL)

{
  StringList *this_00;
  char cVar1;
  char *pcVar2;
  value_type *this_01;
  SingleValueContainerIterator<const_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  itComponents;
  SingleValueContainerIterator<const_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_98;
  value_type local_80;
  value_type local_60;
  string local_40 [32];
  
  FileURL::GetComponentsIterator_abi_cxx11_(&local_98,inFileURL);
  this_00 = &this->mPathComponents;
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(this_00);
  std::__cxx11::string::assign((char *)this);
  if (local_98.
      super_ContainerIterator<const_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      .mCurrentPosition._M_node !=
      local_98.
      super_ContainerIterator<const_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      .mEndPosition._M_node) {
    if (local_98.
        super_ContainerIterator<const_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        .mFirstMove == true) {
      local_98.
      super_ContainerIterator<const_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      .mFirstMove = false;
    }
    else {
      local_98.
      super_ContainerIterator<const_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      .mCurrentPosition._M_node =
           (local_98.
            super_ContainerIterator<const_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            .mCurrentPosition._M_node)->_M_next;
      if (local_98.
          super_ContainerIterator<const_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          .mCurrentPosition._M_node ==
          local_98.
          super_ContainerIterator<const_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          .mEndPosition._M_node) {
        return;
      }
    }
    std::__cxx11::string::string
              ((string *)&local_80,
               (string *)
               (local_98.
                super_ContainerIterator<const_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                .mCurrentPosition._M_node + 1));
    std::__cxx11::string::string
              ((string *)&local_60,
               (string *)
               (local_98.
                super_ContainerIterator<const_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                .mCurrentPosition._M_node + 1));
    pcVar2 = (char *)std::__cxx11::string::at((ulong)&local_80);
    cVar1 = *pcVar2;
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_80);
    if (cVar1 != '|') {
      std::__cxx11::string::string
                ((string *)&local_80,
                 (string *)
                 (local_98.
                  super_ContainerIterator<const_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  .mCurrentPosition._M_node + 1));
      std::__cxx11::
      list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(this_00,&local_80);
      goto LAB_0016b4d6;
    }
    std::__cxx11::string::string
              ((string *)&local_60,
               (string *)
               (local_98.
                super_ContainerIterator<const_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                .mCurrentPosition._M_node + 1));
    std::__cxx11::string::string
              (local_40,(string *)
                        (local_98.
                         super_ContainerIterator<const_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         .mCurrentPosition._M_node + 1));
    std::__cxx11::string::substr((ulong)&local_80,(ulong)&local_60);
    std::__cxx11::string::operator=((string *)this,(string *)&local_80);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string(local_40);
    this_01 = &local_60;
    while (std::__cxx11::string::~string((string *)this_01),
          local_98.
          super_ContainerIterator<const_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          .mCurrentPosition._M_node !=
          local_98.
          super_ContainerIterator<const_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          .mEndPosition._M_node) {
      if (local_98.
          super_ContainerIterator<const_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          .mFirstMove == true) {
        local_98.
        super_ContainerIterator<const_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        .mFirstMove = false;
      }
      else {
        local_98.
        super_ContainerIterator<const_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        .mCurrentPosition._M_node =
             (local_98.
              super_ContainerIterator<const_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              .mCurrentPosition._M_node)->_M_next;
        if (local_98.
            super_ContainerIterator<const_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            .mCurrentPosition._M_node ==
            local_98.
            super_ContainerIterator<const_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            .mEndPosition._M_node) {
          return;
        }
      }
      std::__cxx11::string::string
                ((string *)&local_80,
                 (string *)
                 (local_98.
                  super_ContainerIterator<const_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  .mCurrentPosition._M_node + 1));
      std::__cxx11::
      list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(this_00,&local_80);
LAB_0016b4d6:
      this_01 = &local_80;
    }
  }
  return;
}

Assistant:

void WindowsPath::FromFileURL(const FileURL& inFileURL)
{
    SingleValueContainerIterator<const StringList> itComponents = inFileURL.GetComponentsIterator();

 	mPathComponents.clear();
	mDriveLetter = "";	   
    
    // move to first component (if empty...just return)
    if(!itComponents.MoveNext())
        return;
    
    // check first component, if it's a drive letter
    if(itComponents.GetItem().at(itComponents.GetItem().length() - 1) == '|')
        mDriveLetter = itComponents.GetItem().substr(0,itComponents.GetItem().length() - 1);
    else
        mPathComponents.push_back(itComponents.GetItem());
    
    while(itComponents.MoveNext())
        mPathComponents.push_back(itComponents.GetItem());
        
}